

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_R_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Record_R_PDU::Encode(Record_R_PDU *this)

{
  KDataStream *in_RSI;
  
  Encode((Record_R_PDU *)
         &this[-1].super_Set_Record_R_PDU.super_Simulation_Management_Header.m_ReceivingEntityID.
          super_SimulationIdentifier.m_ui16SiteID,in_RSI);
  return;
}

Assistant:

void Record_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RqId
           << m_ui8ReqRelSrv
           << m_ui8Padding2
           << m_ui16EvntTyp
           << m_ui32SrlNm
           << m_ui32NumRecSets;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << citr->Encode();
    }
}